

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_diamond.cc
# Opt level: O1

void produce<long,disruptor::SingleThreadedStrategy,disruptor::SleepingStrategy<200l,std::chrono::duration<long,std::ratio<1l,1000l>>,1>>
               (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::SleepingStrategy<200L,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>,_1>,_0>
                *s)

{
  int iVar1;
  pointer plVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  long lVar11;
  
  lVar8 = RING_BUFFER_SIZE * counter;
  if (0 < lVar8) {
    lVar6 = 0;
    do {
      uVar4 = disruptor::SingleThreadedStrategy::IncrementAndGet
                        (&s->claim_strategy_,&s->cursor_,&s->gating_sequences_,delta);
      auVar3 = _DAT_0011b040;
      if (uVar4 < delta) {
        if (-1 < (long)uVar4) {
          uVar5 = (ulong)(s->ring_buffer_).index_mask_;
          plVar2 = (s->ring_buffer_).events_.super__Vector_base<long,_std::allocator<long>_>._M_impl
                   .super__Vector_impl_data._M_start;
          auVar9._8_4_ = (int)uVar4;
          auVar9._0_8_ = uVar4;
          auVar9._12_4_ = (int)(uVar4 >> 0x20);
          auVar9 = auVar9 ^ _DAT_0011b040;
          uVar7 = 0;
          auVar10 = _DAT_0011b030;
          do {
            auVar12 = auVar10 ^ auVar3;
            if ((bool)(~(auVar9._4_4_ < auVar12._4_4_ ||
                        auVar9._0_4_ < auVar12._0_4_ && auVar12._4_4_ == auVar9._4_4_) & 1)) {
              plVar2[uVar7 & uVar5] = uVar7;
            }
            if (auVar12._12_4_ <= auVar9._12_4_ &&
                (auVar12._8_4_ <= auVar9._8_4_ || auVar12._12_4_ != auVar9._12_4_)) {
              plVar2[uVar7 + 1 & uVar5] = uVar7 + 1;
            }
            uVar7 = uVar7 + 2;
            lVar11 = auVar10._8_8_;
            auVar10._0_8_ = auVar10._0_8_ + 2;
            auVar10._8_8_ = lVar11 + 2;
          } while ((uVar4 & 0x7ffffffffffffffe) + 2 != uVar7);
        }
      }
      else if (uVar4 - delta < uVar4) {
        iVar1 = (s->ring_buffer_).index_mask_;
        plVar2 = (s->ring_buffer_).events_.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar5 = uVar4;
        do {
          plVar2[uVar5 & (long)iVar1] = uVar5;
          uVar5 = uVar5 - 1;
        } while (uVar4 - delta < uVar5);
      }
      (s->cursor_).sequence_.super___atomic_base<long>._M_i = uVar4;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar8);
  }
  return;
}

Assistant:

void produce(disruptor::Sequencer<T, C, W>& s) {
  int64_t iterations = counter * RING_BUFFER_SIZE;

  for (int64_t i = 0; i < iterations; ++i) {

    int64_t sequence = s.Claim(delta);

    if (sequence < delta) {
      for (int k = 0; k <= sequence; ++k) {
        s[k] = k;
#ifdef PRINT_DEBUG_PROD
        std::stringstream ss;
        ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id()
           << '\n';
        std::cout << ss.str();
#endif
      }

      s.Publish(sequence, delta);
      continue;
    }

    for (int64_t k = sequence; k > sequence - delta; --k) {
      s[k] = k;

#ifdef PRINT_DEBUG_PROD
      std::stringstream ss;
      ss << "Publish seq: " << (k) << ' ' << std::this_thread::get_id() << '\n';
      std::cout << ss.str();
#endif
    }

    s.Publish(sequence, delta);
  }
}